

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::FinishReturnCall(CWriter *this)

{
  bool bVar1;
  Newline local_4a;
  allocator<char> local_49;
  string local_48;
  LabelName local_28;
  Newline local_1b;
  CloseBrace local_1a;
  Newline local_19;
  CloseBrace local_18;
  Newline local_17;
  Newline local_16;
  OpenBrace local_15;
  Newline local_14;
  Newline local_13;
  Newline local_12;
  CloseBrace local_11;
  CWriter *local_10;
  CWriter *this_local;
  
  local_10 = this;
  if ((this->in_tail_callee_ & 1U) == 0) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[68],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,
               (char (*) [68])"while (next->fn) { next->fn(instance_ptr, tail_call_stack, next); }",
               &local_14);
    PushTypes(this,&(this->func_->decl).sig.result_types);
    bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty
                      (&(this->func_->decl).sig.result_types);
    if (!bVar1) {
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::OpenBrace,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],wabt::(anonymous_namespace)::Newline,char_const(&)[52],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_15,&(this->func_->decl).sig.result_types,
                 (char (*) [6])0x37e294,&local_16,
                 (char (*) [52])"wasm_rt_memcpy(&tmp, tail_call_stack, sizeof(tmp));",&local_17);
      Unspill(this,&(this->func_->decl).sig.result_types);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_18,&local_19);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"$Bfunc",&local_49);
    LabelName::LocalName(&local_28,&local_48);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline,char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_1a,&local_1b,(char (*) [6])"goto ",&local_28,
               (char (*) [2])0x37ca1e,&local_4a);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_11,&local_12,(char (*) [8])"return;",&local_13);
  }
  return;
}

Assistant:

void CWriter::FinishReturnCall() {
  if (in_tail_callee_) {
    Write(CloseBrace(), Newline(), "return;", Newline());
    return;
  }

  Write("while (next->fn) { next->fn(instance_ptr, tail_call_stack, next); }",
        Newline());
  PushTypes(func_->decl.sig.result_types);
  if (!func_->decl.sig.result_types.empty()) {
    Write(OpenBrace(), func_->decl.sig.result_types, " tmp;", Newline(),
          "wasm_rt_memcpy(&tmp, tail_call_stack, sizeof(tmp));", Newline());
    Unspill(func_->decl.sig.result_types);
    Write(CloseBrace(), Newline());
  }

  Write(CloseBrace(), Newline(), "goto ", LabelName(kImplicitFuncLabel), ";",
        Newline());
}